

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O2

void __thiscall
cmDebugServerJson::cmDebugServerJson(cmDebugServerJson *this,cmDebugger *debugger,int port)

{
  cmTcpIpConnection *this_00;
  cmConnectionBufferStrategy *bufferStrategy;
  
  this_00 = (cmTcpIpConnection *)operator_new(0x70);
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(0x28);
  bufferStrategy[4]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[2]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[3]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmServerBufferStrategy_006b1bb0;
  bufferStrategy[1]._vptr_cmConnectionBufferStrategy = (_func_int **)(bufferStrategy + 3);
  *(undefined1 *)&bufferStrategy[3]._vptr_cmConnectionBufferStrategy = 0;
  cmTcpIpConnection::cmTcpIpConnection(this_00,port,bufferStrategy);
  cmDebugServerJson(this,debugger,(cmConnection *)this_00);
  return;
}

Assistant:

cmDebugServerJson::cmDebugServerJson(cmDebugger& debugger, int port)
  : cmDebugServerJson(
      debugger, new cmTcpIpConnection(port, new cmServerBufferStrategy()))
{
}